

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSource.hpp
# Opt level: O0

void __thiscall
Outputs::Speaker::SampleSource<GI::AY38910::AY38910<false>,_false,_4>::
apply_samples<(Outputs::Speaker::Action)1>
          (SampleSource<GI::AY38910::AY38910<false>,_false,_4> *this,size_t number_of_samples,
          type *target)

{
  type tVar1;
  AY38910SampleSource<false> *this_00;
  bool bVar2;
  int local_38;
  int whole_steps;
  type level;
  size_t c;
  AY38910<false> *source;
  type *target_local;
  size_t number_of_samples_local;
  SampleSource<GI::AY38910::AY38910<false>,_false,_4> *this_local;
  
  this_00 = (AY38910SampleSource<false> *)(this + -0x454);
  _whole_steps = 0;
  tVar1 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
  while( true ) {
    bVar2 = false;
    if (_whole_steps < number_of_samples) {
      bVar2 = this->master_divider_ != 4;
    }
    if (!bVar2) break;
    apply<(Outputs::Speaker::Action)1,short>(target + _whole_steps,tVar1);
    _whole_steps = _whole_steps + 1;
    this->master_divider_ = this->master_divider_ + 1;
  }
  GI::AY38910::AY38910SampleSource<false>::advance(this_00);
  local_38 = (int)(number_of_samples - _whole_steps >> 2);
  while (local_38 != 0) {
    tVar1 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
    fill<(Outputs::Speaker::Action)1,short*,short>
              (target + _whole_steps,target + _whole_steps + 4,tVar1);
    _whole_steps = _whole_steps + 4;
    GI::AY38910::AY38910SampleSource<false>::advance(this_00);
    local_38 = local_38 + -1;
  }
  GI::AY38910::AY38910SampleSource<false>::level(this_00);
  this->master_divider_ = (int)number_of_samples - (int)_whole_steps;
  tVar1 = GI::AY38910::AY38910SampleSource<false>::level(this_00);
  fill<(Outputs::Speaker::Action)1,short*,short>
            (target + _whole_steps,target + number_of_samples,tVar1);
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, typename SampleT<stereo>::type *target) {
			auto &source = *static_cast<SourceT *>(this);

			if constexpr (divider == 1) {
				while(number_of_samples--) {
					apply<action>(*target, source.level());
					++target;
					source.advance();
				}
			} else {
				std::size_t c = 0;

				// Fill in the tail of any partially-captured level.
				auto level = source.level();
				while(c < number_of_samples && master_divider_ != divider) {
					apply<action>(target[c], level);
					++c;
					++master_divider_;
				}
				source.advance();

				// Provide all full levels.
				auto whole_steps = static_cast<int>((number_of_samples - c) / divider);
				while(whole_steps--) {
					fill<action>(&target[c], &target[c + divider], source.level());
					c += divider;
					source.advance();
				}

				// Provide the head of a further partial capture.
				level = source.level();
				master_divider_ = static_cast<int>(number_of_samples - c);
				fill<action>(&target[c], &target[number_of_samples], source.level());
			}
		}